

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

RealType __thiscall OpenMD::Thermo::getElectronicKinetic(Thermo *this)

{
  double dVar1;
  Snapshot *this_00;
  pointer ppAVar2;
  Atom *pAVar3;
  Molecule *pMVar4;
  pointer ppAVar5;
  double eke;
  RealType RVar6;
  MoleculeIterator miter;
  MoleculeIterator local_20;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasElectronicKineticEnergy == false) {
    local_20._M_node = (_Base_ptr)0x0;
    pMVar4 = SimInfo::beginMolecule(this->info_,&local_20);
    eke = 0.0;
    if (pMVar4 != (Molecule *)0x0) {
      do {
        ppAVar5 = (pMVar4->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppAVar2 = (pMVar4->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppAVar5 != ppAVar2) {
          pAVar3 = *ppAVar5;
          while (pAVar3 != (Atom *)0x0) {
            ppAVar5 = ppAVar5 + 1;
            dVar1 = *(double *)
                     (*(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                       ->atomData).flucQVel.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                               (pAVar3->super_StuntDouble).storage_) +
                     (long)(pAVar3->super_StuntDouble).localIndex_ * 8);
            eke = pAVar3->chargeMass_ * dVar1 * dVar1 + eke;
            if (ppAVar5 == ppAVar2) break;
            pAVar3 = *ppAVar5;
          }
        }
        pMVar4 = SimInfo::nextMolecule(this->info_,&local_20);
      } while (pMVar4 != (Molecule *)0x0);
      eke = eke * 0.5;
    }
    Snapshot::setElectronicKineticEnergy(this_00,eke);
  }
  RVar6 = Snapshot::getElectronicKineticEnergy(this_00);
  return RVar6;
}

Assistant:

RealType Thermo::getElectronicKinetic() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasElectronicKineticEnergy) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator iiter;
      Molecule* mol;
      Atom* atom;
      RealType cvel;
      RealType cmass;
      RealType kinetic(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginFluctuatingCharge(iiter); atom != NULL;
             atom = mol->nextFluctuatingCharge(iiter)) {
          cmass = atom->getChargeMass();
          cvel  = atom->getFlucQVel();
          kinetic += cmass * cvel * cvel;
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &kinetic, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      kinetic *= 0.5;
      snap->setElectronicKineticEnergy(kinetic);
    }

    return snap->getElectronicKineticEnergy();
  }